

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_locked_pcm_open
              (snd_pcm_t **pcm,char *pcm_name,snd_pcm_stream_t stream,snd_config_t *local_config)

{
  snd_config_t *in_RCX;
  snd_pcm_stream_t in_EDX;
  char *in_RSI;
  snd_pcm_t **in_RDI;
  int r;
  int local_24;
  
  pthread_mutex_lock((pthread_mutex_t *)&cubeb_alsa_mutex);
  if (in_RCX == (snd_config_t *)0x0) {
    local_24 = (*cubeb_snd_pcm_open)(in_RDI,in_RSI,in_EDX,1);
  }
  else {
    local_24 = (*cubeb_snd_pcm_open_lconf)(in_RDI,in_RSI,in_EDX,1,in_RCX);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cubeb_alsa_mutex);
  return local_24;
}

Assistant:

static int
alsa_locked_pcm_open(snd_pcm_t ** pcm, char const * pcm_name, snd_pcm_stream_t stream, snd_config_t * local_config)
{
  int r;

  pthread_mutex_lock(&cubeb_alsa_mutex);
  if (local_config) {
    r = WRAP(snd_pcm_open_lconf)(pcm, pcm_name, stream, SND_PCM_NONBLOCK, local_config);
  } else {
    r = WRAP(snd_pcm_open)(pcm, pcm_name, stream, SND_PCM_NONBLOCK);
  }
  pthread_mutex_unlock(&cubeb_alsa_mutex);

  return r;
}